

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Matrix * MatrixPerspective(Matrix *__return_storage_ptr__,double fovY,double aspect,double nearPlane
                          ,double farPlane)

{
  double dVar1;
  float fVar2;
  double dVar3;
  
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m10 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m5 = 0.0;
  __return_storage_ptr__->m9 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m0 = 0.0;
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m8 = 0.0;
  __return_storage_ptr__->m12 = 0.0;
  dVar1 = tan(fovY * 0.5);
  dVar1 = dVar1 * nearPlane;
  dVar3 = aspect * dVar1;
  fVar2 = (float)nearPlane;
  __return_storage_ptr__->m0 = (fVar2 + fVar2) / (float)(dVar3 + dVar3);
  __return_storage_ptr__->m5 = (fVar2 + fVar2) / (float)(dVar1 + dVar1);
  __return_storage_ptr__->m8 = ((float)dVar3 - (float)dVar3) / (float)(dVar3 + dVar3);
  __return_storage_ptr__->m9 = ((float)dVar1 - (float)dVar1) / (float)(dVar1 + dVar1);
  __return_storage_ptr__->m10 = -(fVar2 + (float)farPlane) / (float)(farPlane - nearPlane);
  __return_storage_ptr__->m11 = -1.0;
  __return_storage_ptr__->m14 = (fVar2 * (float)farPlane * -2.0) / (float)(farPlane - nearPlane);
  return __return_storage_ptr__;
}

Assistant:

RMAPI Matrix MatrixPerspective(double fovY, double aspect, double nearPlane, double farPlane)
{
    Matrix result = { 0 };

    double top = nearPlane*tan(fovY*0.5);
    double bottom = -top;
    double right = top*aspect;
    double left = -right;

    // MatrixFrustum(-right, right, -top, top, near, far);
    float rl = (float)(right - left);
    float tb = (float)(top - bottom);
    float fn = (float)(farPlane - nearPlane);

    result.m0 = ((float)nearPlane*2.0f)/rl;
    result.m5 = ((float)nearPlane*2.0f)/tb;
    result.m8 = ((float)right + (float)left)/rl;
    result.m9 = ((float)top + (float)bottom)/tb;
    result.m10 = -((float)farPlane + (float)nearPlane)/fn;
    result.m11 = -1.0f;
    result.m14 = -((float)farPlane*(float)nearPlane*2.0f)/fn;

    return result;
}